

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
shr<unsigned_int>(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,uint n
                 )

{
  uint uVar1;
  pointer pvVar2;
  sbyte sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = 0x200;
  if ((ulong)(n >> 5) < 0x200) {
    uVar8 = (ulong)(n >> 5);
  }
  if (0x1f < n) {
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    if (n < 0x4000) {
      uVar4 = (ulong)(uint)((int)uVar8 * 4);
      lVar5 = -0x800;
      do {
        *(undefined4 *)((long)pvVar2 + lVar5 + 0x800) =
             *(undefined4 *)((long)pvVar2 + lVar5 + uVar4 + 0x800);
        lVar5 = lVar5 + 4;
      } while (uVar4 + lVar5 != 0);
    }
    uVar4 = (ulong)(this->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    if (0x200 - uVar8 != uVar4) {
      memset(pvVar2 + (0x200 - uVar8),0,(uVar4 + uVar8) * 4 - 0x800);
    }
  }
  if (((n & 0x1f) != 0) && (n < 0x4000)) {
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    sVar3 = (sbyte)(n & 0x1f);
    lVar5 = -(ulong)(uint)((int)uVar8 << 2);
    uVar6 = 0;
    do {
      uVar1 = *(uint *)((long)pvVar2 + lVar5 + 0x7fc);
      uVar7 = uVar1 >> sVar3 | uVar6;
      uVar6 = uVar1 << (0x20U - sVar3 & 0x1f);
      *(uint *)((long)pvVar2 + lVar5 + 0x7fc) = uVar7;
      lVar5 = lVar5 + -4;
    } while (lVar5 != -0x800);
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }